

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaIDCAppendNodeTableItem
              (xmlSchemaPSVIIDCBindingPtr_conflict bind,xmlSchemaPSVIIDCNodePtr ntItem)

{
  int iVar1;
  xmlSchemaPSVIIDCNodePtr *ppxVar2;
  int newSize;
  xmlSchemaPSVIIDCNodePtr *tmp;
  xmlSchemaPSVIIDCNodePtr ntItem_local;
  xmlSchemaPSVIIDCBindingPtr_conflict bind_local;
  
  if (bind->sizeNodes <= bind->nbNodes) {
    iVar1 = xmlGrowCapacity(bind->sizeNodes,8,10,1000000000);
    if (iVar1 < 0) {
      xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0);
      return -1;
    }
    ppxVar2 = (xmlSchemaPSVIIDCNodePtr *)(*xmlRealloc)(bind->nodeTable,(long)iVar1 << 3);
    if (ppxVar2 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
      xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0);
      return -1;
    }
    bind->nodeTable = ppxVar2;
    bind->sizeNodes = iVar1;
  }
  iVar1 = bind->nbNodes;
  bind->nbNodes = iVar1 + 1;
  bind->nodeTable[iVar1] = ntItem;
  return 0;
}

Assistant:

static int
xmlSchemaIDCAppendNodeTableItem(xmlSchemaPSVIIDCBindingPtr bind,
				xmlSchemaPSVIIDCNodePtr ntItem)
{
    if (bind->sizeNodes <= bind->nbNodes) {
        xmlSchemaPSVIIDCNodePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(bind->sizeNodes, sizeof(tmp[0]),
                                  10, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlSchemaVErrMemory(NULL);
	    return(-1);
	}
	tmp = xmlRealloc(bind->nodeTable, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlSchemaVErrMemory(NULL);
	    return(-1);
	}

        bind->nodeTable = tmp;
        bind->sizeNodes = newSize;
    }

    bind->nodeTable[bind->nbNodes++] = ntItem;
    return(0);
}